

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
google::protobuf::Arena::
Create<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>(Arena *arena)

{
  Arena *arena_local;
  
  if (arena == (Arena *)0x0) {
    arena_local = (Arena *)operator_new(0x28);
    memset(arena_local,0,0x28);
    internal::InternalMetadata::
    Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Container((Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)arena_local);
  }
  else {
    arena_local = (Arena *)AllocateInternal<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>,false>
                                     (arena);
    memset(arena_local,0,0x28);
    internal::InternalMetadata::
    Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Container((Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)arena_local);
  }
  return (Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)arena_local;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* PROTOBUF_NONNULL
  Create(Arena* PROTOBUF_NULLABLE arena, Args&&... args) {
    if constexpr (is_arena_constructable<T>::value) {
      using Type = std::remove_const_t<T>;
      // DefaultConstruct/CopyConstruct are optimized for messages, which
      // are both arena constructible and destructor skippable and they
      // assume much. Don't use these functions unless the invariants
      // hold.
      if constexpr (is_destructor_skippable<T>::value) {
        constexpr auto construct_type = GetConstructType<T, Args&&...>();
        // We delegate to DefaultConstruct/CopyConstruct where appropriate
        // because protobuf generated classes have external templates for
        // these functions for code size reasons. When `if constexpr` is not
        // available always use the fallback.
        if constexpr (construct_type == ConstructType::kDefault) {
          return static_cast<Type*>(DefaultConstruct<Type>(arena));
        } else if constexpr (construct_type == ConstructType::kCopy) {
          return static_cast<Type*>(CopyConstruct<Type>(arena, &args...));
        }
      }
      return CreateArenaCompatible<Type>(arena, std::forward<Args>(args)...);
    } else {
      if (ABSL_PREDICT_FALSE(arena == nullptr)) {
        return new T(std::forward<Args>(args)...);
      }
      return new (arena->AllocateInternal<T>()) T(std::forward<Args>(args)...);
    }
  }